

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall
QKmsDevice::enumerateProperties
          (QKmsDevice *this,drmModeObjectPropertiesPtr objProps,PropCallback *callback)

{
  undefined8 uVar1;
  bool bVar2;
  drmModePropertyPtr prop_00;
  _drmModeProperty *in_RDX;
  uint *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  int i_3;
  int i_2;
  int i_1;
  int i;
  quint64 value;
  drmModePropertyPtr prop;
  uint32_t propIdx;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_10;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  function<void_(_drmModeProperty_*,_unsigned_long_long)> *in_stack_fffffffffffffd88;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd90;
  uint local_258;
  uint local_254;
  int local_250;
  int local_24c;
  uint local_234;
  char local_218 [32];
  char local_1f8 [32];
  char local_1d8 [32];
  char local_1b8 [32];
  char local_198 [32];
  char local_178 [32];
  char local_158 [32];
  char local_138 [32];
  char local_118 [32];
  char local_f8 [32];
  char local_d8 [32];
  undefined8 local_b8;
  ulong local_b0;
  undefined8 local_a8;
  ulong local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined8 local_88;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_234 = 0; local_234 < *in_RSI; local_234 = local_234 + 1) {
    prop_00 = (drmModePropertyPtr)
              drmModeGetProperty(*(undefined4 *)&in_RDI[1].context.file,
                                 *(undefined4 *)(*(long *)(in_RSI + 2) + (ulong)local_234 * 4));
    if (prop_00 != (drmModePropertyPtr)0x0) {
      uVar1 = *(undefined8 *)(*(long *)(in_RSI + 4) + (ulong)local_234 * 8);
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117a4b);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                   (char *)in_stack_fffffffffffffd88,(char *)0x117a64);
        QMessageLogger::debug
                  (local_d8,"  property %d: id = %u name = \'%s\'",(ulong)local_234,
                   (ulong)prop_00->prop_id,prop_00->name);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      bVar2 = propTypeIs(prop_00,0x80);
      if (bVar2) {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        local_20 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117b03);
          QMessageLogger::QMessageLogger
                    (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                     (char *)in_stack_fffffffffffffd88,(char *)0x117b1c);
          QMessageLogger::debug
                    (local_f8,"  type is SIGNED_RANGE, value is %lld, possible values are:",uVar1);
          local_20 = local_20 & 0xffffffffffffff00;
        }
        for (local_24c = 0; local_24c < prop_00->count_values; local_24c = local_24c + 1) {
          local_38 = 0xaaaaaaaaaaaaaaaa;
          local_30 = 0xaaaaaaaaaaaaaaaa;
          qLcKmsDebug();
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117bae);
            QMessageLogger::QMessageLogger
                      (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (char *)in_stack_fffffffffffffd88,(char *)0x117bc7);
            QMessageLogger::debug(local_118,"    %lld",prop_00->values[local_24c]);
            local_30 = local_30 & 0xffffffffffffff00;
          }
        }
      }
      else {
        bVar2 = propTypeIs(prop_00,2);
        if (bVar2) {
          local_48 = 0xaaaaaaaaaaaaaaaa;
          local_40 = 0xaaaaaaaaaaaaaaaa;
          qLcKmsDebug();
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
            anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117c7b);
            QMessageLogger::QMessageLogger
                      (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                       (char *)in_stack_fffffffffffffd88,(char *)0x117c94);
            QMessageLogger::debug
                      (local_138,"  type is RANGE, value is %llu, possible values are:",uVar1);
            local_40 = local_40 & 0xffffffffffffff00;
          }
          for (local_250 = 0; local_250 < prop_00->count_values; local_250 = local_250 + 1) {
            local_58 = 0xaaaaaaaaaaaaaaaa;
            local_50 = 0xaaaaaaaaaaaaaaaa;
            qLcKmsDebug();
            anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
            while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_58), bVar2) {
              anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117d26);
              QMessageLogger::QMessageLogger
                        (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                         (char *)in_stack_fffffffffffffd88,(char *)0x117d3f);
              QMessageLogger::debug(local_158,"    %llu",prop_00->values[local_250]);
              local_50 = local_50 & 0xffffffffffffff00;
            }
          }
        }
        else {
          bVar2 = propTypeIs(prop_00,8);
          if (bVar2) {
            local_68 = 0xaaaaaaaaaaaaaaaa;
            local_60 = 0xaaaaaaaaaaaaaaaa;
            qLcKmsDebug();
            anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
            while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_68), bVar2) {
              anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117df3);
              QMessageLogger::QMessageLogger
                        (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                         (char *)in_stack_fffffffffffffd88,(char *)0x117e0c);
              QMessageLogger::debug
                        (local_178,"  type is ENUM, value is %llu, possible values are:",uVar1);
              local_60 = local_60 & 0xffffffffffffff00;
            }
            for (local_254 = 0; (int)local_254 < prop_00->count_enums; local_254 = local_254 + 1) {
              local_78 = 0xaaaaaaaaaaaaaaaa;
              local_70 = 0xaaaaaaaaaaaaaaaa;
              qLcKmsDebug();
              anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
              QLoggingCategoryMacroHolder
                        (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
              while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_78), bVar2)
              {
                anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117e9e);
                QMessageLogger::QMessageLogger
                          (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                           (char *)in_stack_fffffffffffffd88,(char *)0x117eb7);
                QMessageLogger::debug
                          (local_198,"    enum %d: %s - %llu",(ulong)local_254,
                           prop_00->enums[(int)local_254].name,prop_00->enums[(int)local_254].value)
                ;
                local_70 = local_70 & 0xffffffffffffff00;
              }
            }
          }
          else {
            bVar2 = propTypeIs(prop_00,0x20);
            if (bVar2) {
              local_88 = 0xaaaaaaaaaaaaaaaa;
              local_80 = 0xaaaaaaaaaaaaaaaa;
              qLcKmsDebug();
              anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
              QLoggingCategoryMacroHolder
                        (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
              while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                             operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_88), bVar2)
              {
                anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                          ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x117f91);
                QMessageLogger::QMessageLogger
                          (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                           (char *)in_stack_fffffffffffffd88,(char *)0x117faa);
                QMessageLogger::debug
                          (local_1b8,"  type is BITMASK, value is %llu, possible bits are:",uVar1);
                local_80 = local_80 & 0xffffffffffffff00;
              }
              for (local_258 = 0; (int)local_258 < prop_00->count_enums; local_258 = local_258 + 1)
              {
                local_98 = 0xaaaaaaaaaaaaaaaa;
                local_90 = 0xaaaaaaaaaaaaaaaa;
                qLcKmsDebug();
                anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder
                          (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
                while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                               operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_98),
                      bVar2) {
                  anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11803f);
                  QMessageLogger::QMessageLogger
                            (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                             (char *)in_stack_fffffffffffffd88,(char *)0x118058);
                  in_stack_fffffffffffffd90 =
                       (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       prop_00->enums[(int)local_258].name;
                  QMessageLogger::debug
                            (local_1d8,"    bitmask %d: %s - %u",(ulong)local_258,
                             in_stack_fffffffffffffd90,
                             (ulong)(uint)(1 << ((byte)prop_00->enums[(int)local_258].value & 0x1f))
                            );
                  local_90 = local_90 & 0xffffffffffffff00;
                }
              }
            }
            else {
              bVar2 = propTypeIs(prop_00,0x10);
              if (bVar2) {
                local_a8 = 0xaaaaaaaaaaaaaaaa;
                local_a0 = 0xaaaaaaaaaaaaaaaa;
                qLcKmsDebug();
                anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                QLoggingCategoryMacroHolder
                          (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88);
                while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                               operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_a8),
                      bVar2) {
                  anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x118147);
                  QMessageLogger::QMessageLogger
                            (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                             (char *)in_stack_fffffffffffffd88,(char *)0x118160);
                  QMessageLogger::debug(local_1f8,"  type is BLOB");
                  local_a0 = local_a0 & 0xffffffffffffff00;
                }
              }
              else {
                bVar2 = propTypeIs(prop_00,0x40);
                if (bVar2) {
                  local_b8 = 0xaaaaaaaaaaaaaaaa;
                  local_b0 = 0xaaaaaaaaaaaaaaaa;
                  qLcKmsDebug();
                  anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                  QLoggingCategoryMacroHolder
                            (in_stack_fffffffffffffd90,(QLoggingCategory *)in_stack_fffffffffffffd88
                            );
                  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                 operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_b8),
                        bVar2) {
                    anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1181f0);
                    QMessageLogger::QMessageLogger
                              (in_RDI,(char *)in_RDX,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20)
                               ,(char *)in_stack_fffffffffffffd88,(char *)0x118206);
                    QMessageLogger::debug(local_218,"  type is OBJECT");
                    local_b0 = local_b0 & 0xffffffffffffff00;
                  }
                }
              }
            }
          }
        }
      }
      std::function<void_(_drmModeProperty_*,_unsigned_long_long)>::operator()
                (in_stack_fffffffffffffd88,in_RDX,(unsigned_long_long)in_stack_fffffffffffffd90);
      drmModeFreeProperty(prop_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKmsDevice::enumerateProperties(drmModeObjectPropertiesPtr objProps, PropCallback callback)
{
    for (uint32_t propIdx = 0; propIdx < objProps->count_props; ++propIdx) {
        drmModePropertyPtr prop = drmModeGetProperty(m_dri_fd, objProps->props[propIdx]);
        if (!prop)
            continue;

        const quint64 value = objProps->prop_values[propIdx];
        qCDebug(qLcKmsDebug, "  property %d: id = %u name = '%s'", propIdx, prop->prop_id, prop->name);

        if (propTypeIs(prop, DRM_MODE_PROP_SIGNED_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is SIGNED_RANGE, value is %lld, possible values are:", qint64(value));
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %lld", qint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_RANGE)) {
            qCDebug(qLcKmsDebug, "  type is RANGE, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_values; ++i)
                qCDebug(qLcKmsDebug, "    %llu", quint64(prop->values[i]));
        } else if (propTypeIs(prop, DRM_MODE_PROP_ENUM)) {
            qCDebug(qLcKmsDebug, "  type is ENUM, value is %llu, possible values are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    enum %d: %s - %llu", i, prop->enums[i].name, quint64(prop->enums[i].value));
        } else if (propTypeIs(prop, DRM_MODE_PROP_BITMASK)) {
            qCDebug(qLcKmsDebug, "  type is BITMASK, value is %llu, possible bits are:", value);
            for (int i = 0; i < prop->count_enums; ++i)
                qCDebug(qLcKmsDebug, "    bitmask %d: %s - %u", i, prop->enums[i].name, 1 << prop->enums[i].value);
        } else if (propTypeIs(prop, DRM_MODE_PROP_BLOB)) {
            qCDebug(qLcKmsDebug, "  type is BLOB");
        } else if (propTypeIs(prop, DRM_MODE_PROP_OBJECT)) {
            qCDebug(qLcKmsDebug, "  type is OBJECT");
        }

        callback(prop, value);

        drmModeFreeProperty(prop);
    }
}